

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateJavascriptOperatorsIsConstructorGotoElse
          (Lowerer *this,Instr *instrInsert,RegOpnd *instanceRegOpnd,LabelInstr *labelReturnTrue,
          LabelInstr *labelReturnFalse)

{
  Func *func_00;
  byte bVar1;
  uint32 uVar2;
  DWORD DVar3;
  LabelInstr *this_00;
  LabelInstr *target;
  RegOpnd *baseOpnd;
  RegOpnd *dst;
  Loop *pLVar4;
  IndirOpnd *pIVar5;
  IntConstOpnd *pIVar6;
  IndirOpnd *indirOpnd;
  Loop *loop;
  RegOpnd *indir1RegOpnd;
  RegOpnd *indir0RegOpnd;
  LabelInstr *labelNotProxy;
  LabelInstr *labelProxyLoop;
  Func *func;
  LabelInstr *labelReturnFalse_local;
  LabelInstr *labelReturnTrue_local;
  RegOpnd *instanceRegOpnd_local;
  Instr *instrInsert_local;
  Lowerer *this_local;
  
  func_00 = instrInsert->m_func;
  this_00 = InsertLoopTopLabel(this,instrInsert);
  target = IR::LabelInstr::New(Label,func_00,false);
  baseOpnd = IR::RegOpnd::New(TyUint64,func_00);
  dst = IR::RegOpnd::New(TyUint32,func_00);
  pLVar4 = IR::LabelInstr::GetLoop(this_00);
  BVSparse<Memory::JitArenaAllocator>::Set
            ((pLVar4->regAlloc).liveOnBackEdgeSyms,(instanceRegOpnd->m_sym->super_Sym).m_id);
  uVar2 = Js::RecyclableObject::GetOffsetOfType();
  pIVar5 = IR::IndirOpnd::New(instanceRegOpnd,uVar2,TyUint64,func_00,false);
  InsertMove(&baseOpnd->super_Opnd,&pIVar5->super_Opnd,instrInsert,true);
  uVar2 = Js::Type::GetOffsetOfTypeId();
  pIVar5 = IR::IndirOpnd::New(baseOpnd,uVar2,TyUint32,func_00,false);
  InsertMove(&dst->super_Opnd,&pIVar5->super_Opnd,instrInsert,true);
  pIVar6 = IR::IntConstOpnd::New(0x1a,TyUint32,func_00,true);
  InsertCompareBranch(this,&dst->super_Opnd,&pIVar6->super_Opnd,BrNeq_A,target,instrInsert,false);
  DVar3 = Js::JavascriptProxy::GetOffsetOfTarget();
  pIVar5 = IR::IndirOpnd::New(instanceRegOpnd,DVar3,TyUint64,func_00,false);
  InsertMove(&instanceRegOpnd->super_Opnd,&pIVar5->super_Opnd,instrInsert,true);
  InsertBranch(Br,this_00,instrInsert);
  IR::Instr::InsertBefore(instrInsert,&target->super_Instr);
  pIVar6 = IR::IntConstOpnd::New(0x1b,TyUint32,func_00,true);
  InsertCompareBranch(this,&dst->super_Opnd,&pIVar6->super_Opnd,BrNeq_A,labelReturnFalse,instrInsert
                      ,false);
  bVar1 = Js::JavascriptFunction::GetOffsetOfFunctionInfo();
  pIVar5 = IR::IndirOpnd::New(instanceRegOpnd,(uint)bVar1,TyUint64,func_00,false);
  InsertMove(&baseOpnd->super_Opnd,&pIVar5->super_Opnd,instrInsert,true);
  DVar3 = Js::FunctionInfo::GetAttributesOffset();
  pIVar5 = IR::IndirOpnd::New(baseOpnd,DVar3,TyUint32,func_00,false);
  InsertMove(&dst->super_Opnd,&pIVar5->super_Opnd,instrInsert,true);
  pIVar6 = IR::IntConstOpnd::New(1,TyUint32,func_00,true);
  InsertTestBranch(&dst->super_Opnd,&pIVar6->super_Opnd,BrNeq_A,labelReturnFalse,instrInsert);
  InsertBranch(Br,labelReturnTrue,instrInsert);
  return;
}

Assistant:

void
Lowerer::GenerateJavascriptOperatorsIsConstructorGotoElse(IR::Instr *instrInsert, IR::RegOpnd *instanceRegOpnd, IR::LabelInstr *labelReturnTrue, IR::LabelInstr *labelReturnFalse)
{
    //  $ProxyLoop:
    //  // if (!VarIs<RecyclableObject>(instance)) { goto $ReturnFalse }; // omitted: VarIs<RecyclableObject>(instance) always true
    //  MOV s0, instance->type
    //  MOV s1, s0->typeId
    //  CMP s1, TypeIds_Proxy
    //  JNE $NotProxy
    //
    //  MOV instance, instance->target
    //  JMP $ProxyLoop
    //
    //  $NotProxy:
    //  CMP s1, TypeIds_Function
    //  JNE $ReturnFalse   // external
    //
    //  MOV s0, instance->functionInfo
    //  MOV s1, s0->attributes
    //  TEST s1, ErrorOnNew
    //  JNE $ReturnFalse   // external
    //
    //  JMP $ReturnTrue    // external

    Func *func = instrInsert->m_func;

    IR::LabelInstr *labelProxyLoop = InsertLoopTopLabel(instrInsert);

    IR::LabelInstr *labelNotProxy = IR::LabelInstr::New(Js::OpCode::Label, func, false);

    IR::RegOpnd *indir0RegOpnd = IR::RegOpnd::New(TyMachPtr, func);
    IR::RegOpnd *indir1RegOpnd = IR::RegOpnd::New(TyUint32, func);

    Loop * loop = labelProxyLoop->GetLoop();
    loop->regAlloc.liveOnBackEdgeSyms->Set(instanceRegOpnd->m_sym->m_id);

    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, func);
    Lowerer::InsertMove(indir0RegOpnd, indirOpnd, instrInsert);

    indirOpnd = IR::IndirOpnd::New(indir0RegOpnd, Js::Type::GetOffsetOfTypeId(), TyUint32, func);
    Lowerer::InsertMove(indir1RegOpnd, indirOpnd, instrInsert);

    InsertCompareBranch(indir1RegOpnd, IR::IntConstOpnd::New(Js::TypeIds_Proxy, TyUint32, func, true), Js::OpCode::BrNeq_A, labelNotProxy, instrInsert);

    indirOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::JavascriptProxy::GetOffsetOfTarget(), TyMachPtr, func);
    Lowerer::InsertMove(instanceRegOpnd, indirOpnd, instrInsert);

    InsertBranch(Js::OpCode::Br, labelProxyLoop, instrInsert);

    instrInsert->InsertBefore(labelNotProxy);

    InsertCompareBranch(indir1RegOpnd, IR::IntConstOpnd::New(Js::TypeIds_Function, TyUint32, func, true), Js::OpCode::BrNeq_A, labelReturnFalse, instrInsert);

    indirOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::JavascriptFunction::GetOffsetOfFunctionInfo(), TyMachPtr, func);
    Lowerer::InsertMove(indir0RegOpnd, indirOpnd, instrInsert);

    indirOpnd = IR::IndirOpnd::New(indir0RegOpnd, Js::FunctionInfo::GetAttributesOffset(), TyUint32, func);
    Lowerer::InsertMove(indir1RegOpnd, indirOpnd, instrInsert);

    InsertTestBranch(indir1RegOpnd, IR::IntConstOpnd::New(Js::FunctionInfo::Attributes::ErrorOnNew, TyUint32, func, true), Js::OpCode::BrNeq_A, labelReturnFalse, instrInsert);

    InsertBranch(Js::OpCode::Br, labelReturnTrue, instrInsert);
}